

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void multi_deltimeout(Curl_easy *data,expire_id eid)

{
  Curl_llist *list;
  time_node *n;
  Curl_llist *timeoutlist;
  Curl_llist_element *e;
  expire_id eid_local;
  Curl_easy *data_local;
  
  list = &(data->state).timeoutlist;
  timeoutlist = (Curl_llist *)list->head;
  while( true ) {
    if (timeoutlist == (Curl_llist *)0x0) {
      return;
    }
    if (*(expire_id *)&timeoutlist->head[1].next == eid) break;
    timeoutlist = (Curl_llist *)timeoutlist->dtor;
  }
  Curl_llist_remove(list,(Curl_llist_element *)timeoutlist,(void *)0x0);
  return;
}

Assistant:

static void
multi_deltimeout(struct Curl_easy *data, expire_id eid)
{
  struct Curl_llist_element *e;
  struct Curl_llist *timeoutlist = &data->state.timeoutlist;
  /* find and remove the specific node from the list */
  for(e = timeoutlist->head; e; e = e->next) {
    struct time_node *n = (struct time_node *)e->ptr;
    if(n->eid == eid) {
      Curl_llist_remove(timeoutlist, e, NULL);
      return;
    }
  }
}